

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

bool QFontDatabase::removeApplicationFallbackFontFamily(Script script,QString *familyName)

{
  bool bVar1;
  byte bVar2;
  QMessageLogger *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  QFontDatabasePrivate *db;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QMutexLocker<QRecursiveMutex> locker;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QFontDatabasePrivate *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffac;
  QDebug local_30;
  char *t;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff90,
             (QRecursiveMutex *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if ((in_EDI < 2) || (0xaa < in_EDI)) {
    t = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcFontDb();
    anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff90,
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffd8);
      if (!bVar1) break;
      anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x7477f9);
      QMessageLogger::QMessageLogger
                (in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (char *)0x74780f);
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffffac,in_EDI),t);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      QDebug::~QDebug(&local_30);
    }
    bVar2 = false;
  }
  else {
    if (in_EDI == 3) {
      in_EDI = 2;
    }
    in_stack_ffffffffffffff90 = QFontDatabasePrivate::instance();
    bVar2 = QFontDatabasePrivate::removeApplicationFallbackFontFamily
                      ((QFontDatabasePrivate *)CONCAT44(in_stack_ffffffffffffffac,in_EDI),
                       (ExtendedScript)((ulong)lVar3 >> 0x20),(QString *)in_RSI);
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::removeApplicationFallbackFontFamily(QChar::Script script, const QString &familyName)
{
    QMutexLocker locker(fontDatabaseMutex());

    if (script < QChar::Script_Common || script >= QChar::ScriptCount) {
        qCWarning(lcFontDb) << "Invalid script passed to removeApplicationFallbackFontFamily:" << script;
        return false;
    }

    if (script == QChar::Script_Latin)
        script = QChar::Script_Common;

    auto *db = QFontDatabasePrivate::instance();
    return db->removeApplicationFallbackFontFamily(QFontDatabasePrivate::ExtendedScript(script),
                                                   familyName);
}